

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O1

void lj_meta_call(lua_State *L,TValue *func,TValue *top)

{
  cTValue *pcVar1;
  
  pcVar1 = lj_meta_lookup(L,func,MM_call);
  if ((pcVar1->field_2).it == 0xfffffff7) {
    if (func < top) {
      do {
        *top = top[-1];
        top = top + -1;
      } while (func < top);
    }
    func->field_2 = (anon_struct_8_2_fd66bcdd_for_TValue_2)*pcVar1;
    return;
  }
  lj_err_optype_call(L,func);
}

Assistant:

void lj_meta_call(lua_State *L, TValue *func, TValue *top)
{
  cTValue *mo = lj_meta_lookup(L, func, MM_call);
  TValue *p;
  if (!tvisfunc(mo))
    lj_err_optype_call(L, func);
  for (p = top; p > func+2*LJ_FR2; p--) copyTV(L, p, p-1);
  if (LJ_FR2) copyTV(L, func+2, func);
  copyTV(L, func, mo);
}